

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg(command_conflict *cmd,char *arg,cmd_arg_type type,cmd_arg_data_conflict *data)

{
  char *pcVar1;
  int iVar2;
  wchar_t wVar3;
  char *__s1;
  long lVar4;
  
  lVar4 = 5;
  pcVar1 = cmd->arg[0].name;
  do {
    __s1 = pcVar1;
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return L'\xffffffff';
    }
    iVar2 = strcmp(__s1,arg);
    pcVar1 = __s1 + 0x28;
  } while (iVar2 != 0);
  if (((cmd_arg *)(__s1 + -0x10))->type == type) {
    *data = *(cmd_arg_data_conflict *)(__s1 + -8);
    wVar3 = L'\0';
  }
  else {
    wVar3 = L'\xfffffffe';
  }
  return wVar3;
}

Assistant:

static int cmd_get_arg(struct command *cmd, const char *arg,
					   enum cmd_arg_type type, union cmd_arg_data *data)
{
	size_t i;

	for (i = 0; i < CMD_MAX_ARGS; i++) {
		if (streq(cmd->arg[i].name, arg)) {
			if (cmd->arg[i].type != type)
				return CMD_ARG_WRONG_TYPE;

			*data = cmd->arg[i].data;
			return CMD_OK;
		}
	}

	return CMD_ARG_NOT_PRESENT;
 }